

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayStencil
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  code *pcVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  GLubyte *pGVar9;
  Functions *gl;
  GLuint test_index_local;
  TextureCubeMapArrayStencilAttachments *this_local;
  long lVar8;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  fillStencilData(this,test_index);
  pcVar1 = *(code **)(lVar8 + 0x1398);
  GVar3 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
  GVar4 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
  GVar5 = CubeMapArrayDataStorage::getDepth(this->m_cube_map_array_data + test_index);
  (*pcVar1)(0x9009,1,0x88f0,GVar3,GVar4,GVar5);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not create an immutable stencil texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x215);
  pcVar1 = *(code **)(lVar8 + 0x13c0);
  GVar3 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
  GVar4 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
  GVar5 = CubeMapArrayDataStorage::getDepth(this->m_cube_map_array_data + test_index);
  pGVar9 = CubeMapArrayDataStorage::getDataArray(this->m_cube_map_array_data + test_index);
  (*pcVar1)(0x9009,0,0,0,0,GVar3,GVar4,GVar5,0x84f9,0x84fa,pGVar9);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not fill allocated texture storage with texture data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x223);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayStencil(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	fillStencilData(test_index);

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY,					   /* target */
					1,											   /* levels */
					GL_DEPTH24_STENCIL8,						   /* internalformat */
					m_cube_map_array_data[test_index].getWidth(),  /* width */
					m_cube_map_array_data[test_index].getHeight(), /* height */
					m_cube_map_array_data[test_index].getDepth()); /* depth */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create an immutable stencil texture storage!");

	gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY,							/* target */
					 0,													/* level */
					 0,													/* xoffset */
					 0,													/* yoffset */
					 0,													/* zoffset */
					 m_cube_map_array_data[test_index].getWidth(),		/* width */
					 m_cube_map_array_data[test_index].getHeight(),		/* height */
					 m_cube_map_array_data[test_index].getDepth(),		/* depth */
					 GL_DEPTH_STENCIL,									/* format */
					 GL_UNSIGNED_INT_24_8,								/* type */
					 m_cube_map_array_data[test_index].getDataArray()); /* data */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not fill allocated texture storage with texture data!");
}